

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_minimal_logger__on_chk(fct_logger_i *self_,fct_logger_evt_t *e)

{
  if (e->chk->is_pass != 0) {
    fputs(".",_stdout);
    return;
  }
  fputs("x",_stdout);
  fct_logger_record_failure(e->chk,(fct_nlist_t *)(self_ + 1));
  return;
}

Assistant:

static void
fct_minimal_logger__on_chk(
    fct_logger_i *self_,
    fct_logger_evt_t const *e
)
{
    fct_minimal_logger_t *self = (fct_minimal_logger_t*)self_;
    if ( fctchk__is_pass(e->chk) )
    {
        fputs(".", stdout);
    }
    else
    {
        fputs("x", stdout);
        fct_logger_record_failure(e->chk, &(self->failed_cndtns_list));

    }
}